

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

void __thiscall
pstore::storage::storage<pstore::file::file_handle>
          (storage *this,shared_ptr<pstore::file::file_handle> *file)

{
  element_type *peVar1;
  shared_ptr<pstore::file::file_handle> local_30;
  
  std::make_unique<std::array<pstore::sat_entry,65536ul>>();
  std::static_pointer_cast<pstore::file::file_base,pstore::file::file_handle>
            ((shared_ptr<pstore::file::file_handle> *)&this->file_);
  std::make_unique<pstore::system_page_size>();
  peVar1 = local_30.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_30.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->page_size_)._M_t.
  super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
  .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl =
       (system_page_size_interface *)peVar1;
  std::unique_ptr<pstore::system_page_size,_std::default_delete<pstore::system_page_size>_>::
  ~unique_ptr((unique_ptr<pstore::system_page_size,_std::default_delete<pstore::system_page_size>_>
               *)&local_30);
  std::static_pointer_cast<pstore::file::file_handle,pstore::file::file_handle>(&local_30);
  region::get_factory((region *)&this->region_factory_,&local_30,0x100000000,0x400000);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (*((this->region_factory_)._M_t.
     super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>.
     _M_t.
     super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
     .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl)->_vptr_factory[2])
            (&this->regions_);
  return;
}

Assistant:

explicit storage (std::shared_ptr<File> const & file)
                : file_{std::static_pointer_cast<file::file_base> (file)}
                , region_factory_{region::get_factory (
                      std::static_pointer_cast<file::file_handle> (file), full_region_size,
                      min_region_size)}
                , regions_{region_factory_->init ()} {}